

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O2

void __thiscall Wasm::WasmBinaryReader::ReadCustomSection(WasmBinaryReader *this)

{
  byte *pbVar1;
  byte *pbVar2;
  CustomSection customSection;
  long lVar3;
  undefined4 uStack_24;
  undefined4 uStack_14;
  
  pbVar1 = this->m_pc;
  pbVar2 = (this->m_currentSection).end;
  lVar3 = (long)pbVar2 - (long)pbVar1;
  if ((pbVar1 <= pbVar2) && (lVar3 + 0x80000000U >> 0x20 == 0)) {
    customSection._12_4_ = uStack_24;
    customSection.nameLength = (this->m_currentSection).nameLength;
    customSection._28_4_ = uStack_14;
    customSection.payloadSize = (int)lVar3;
    customSection.name = (this->m_currentSection).name;
    customSection.payload = pbVar1;
    Js::WebAssemblyModule::AddCustomSection(this->m_module,customSection);
    this->m_pc = (this->m_currentSection).end;
    return;
  }
  ThrowDecodingError(this,L"Invalid custom section size");
}

Assistant:

void WasmBinaryReader::ReadCustomSection()
{
    CustomSection customSection;
    customSection.name = m_currentSection.name;
    customSection.nameLength = m_currentSection.nameLength;
    customSection.payload = m_pc;

    size_t size = m_currentSection.end - m_pc;
    if (m_currentSection.end < m_pc || !Math::FitsInDWord(size))
    {
        ThrowDecodingError(_u("Invalid custom section size"));
    }
    customSection.payloadSize = (uint32)size;
    m_module->AddCustomSection(customSection);
    m_pc = m_currentSection.end;
}